

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HinOut.cpp
# Opt level: O2

void __thiscall HinOut::compareData(HinOut *this,int lvl)

{
  long lVar1;
  double *pdVar2;
  pointer piVar3;
  ostream *poVar4;
  ulong uVar5;
  pointer piVar6;
  size_t l;
  HinOut *this_00;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  long local_80;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> columnA;
  pair<int,_double> p;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> columnOA;
  
  if ((this->super_HPreData).numCol != this->onumCol) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Column counts differ");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  if ((this->super_HPreData).numRow != this->onumRow) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Row counts differ");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  if (this->AcountX != this->oAcountX) {
    poVar4 = std::operator<<((ostream *)&std::cout,"AcountX counts differ");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  local_80 = 8;
  for (lVar8 = 0; lVar8 < (this->super_HPreData).numCol; lVar8 = lVar8 + 1) {
    piVar6 = (this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->oAstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (piVar6[lVar8 + 1] - piVar6[lVar8] != piVar3[lVar8 + 1] - piVar3[lVar8]) {
      poVar4 = std::operator<<((ostream *)&std::cout,"col length different: col[");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)lVar8);
      std::operator<<(poVar4,"]\n");
    }
    local_80 = local_80 + 0x10;
  }
  this_00 = (HinOut *)&std::cout;
  std::ostream::flush();
  lVar8 = 0;
  while( true ) {
    uVar5 = (ulong)(this->super_HPreData).numCol;
    if ((long)uVar5 <= lVar8) break;
    columnA.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    columnA.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    columnA.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    columnOA.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    columnOA.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    columnOA.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    piVar6 = (this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar1 = lVar8 + 1;
    for (lVar9 = (long)piVar6[lVar8]; lVar9 < piVar6[lVar1]; lVar9 = lVar9 + 1) {
      p.first = (this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar9];
      p.second = (this->super_HPreData).Avalue.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar9];
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::push_back
                (&columnA,&p);
      piVar6 = (this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    piVar6 = (this->oAstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar9 = (long)piVar6[lVar8]; lVar9 < piVar6[lVar1]; lVar9 = lVar9 + 1) {
      lVar10 = 0;
      for (uVar5 = 0;
          uVar5 < (ulong)((long)columnA.
                                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)columnA.
                                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4); uVar5 = uVar5 + 1)
      {
        if (*(int *)((long)&(columnA.
                             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->first + lVar10) ==
            (this->oAindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar9]) {
          dVar11 = *(double *)
                    ((long)&(columnA.
                             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->second + lVar10);
          pdVar2 = (this->oAvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar9;
          if ((dVar11 != *pdVar2) || (NAN(dVar11) || NAN(*pdVar2))) {
            poVar4 = std::operator<<((ostream *)&std::cout,"mismatch in row ");
            poVar4 = (ostream *)
                     std::ostream::operator<<
                               (poVar4,(this->super_HPreData).Aindex.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start[lVar9]);
            poVar4 = std::operator<<(poVar4," col ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)lVar8);
            std::operator<<(poVar4," in Avalue: ");
            poVar4 = std::ostream::_M_insert<double>
                               (*(double *)
                                 ((long)&(columnA.
                                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->first +
                                 local_80));
            std::operator<<(poVar4," in oAvalue: ");
            poVar4 = std::ostream::_M_insert<double>
                               ((this->oAvalue).super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar9]);
            std::endl<char,std::char_traits<char>>(poVar4);
          }
          else {
            std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::erase
                      (&columnA,(pair<int,_double> *)
                                ((long)&(columnA.
                                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->first + lVar10)
                      );
          }
        }
        lVar10 = lVar10 + 0x10;
      }
      piVar6 = (this->oAstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
    ~_Vector_base(&columnOA.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 );
    this_00 = (HinOut *)&columnA;
    std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
    ~_Vector_base((_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  &columnA);
    lVar8 = lVar1;
  }
  if (0 < lvl) {
    for (lVar8 = 0; iVar7 = (int)lVar8, lVar8 < (int)uVar5; lVar8 = lVar8 + 1) {
      dVar11 = getdiff(this_00,(this->super_HPreData).colCost.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar8],
                       (this->ocolCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar8]);
      if ((dVar11 != 0.0) || (NAN(dVar11))) {
        poVar4 = std::operator<<((ostream *)&std::cout,"colCost[");
        this_00 = (HinOut *)std::ostream::operator<<(poVar4,iVar7);
        std::operator<<((ostream *)this_00,"]");
      }
      dVar11 = getdiff(this_00,(this->super_HPreData).colLower.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar8],
                       (this->ocolLower).super__Vector_base<double,_std::allocator<double>_>._M_impl
                       .super__Vector_impl_data._M_start[lVar8]);
      if ((dVar11 != 0.0) || (NAN(dVar11))) {
        poVar4 = std::operator<<((ostream *)&std::cout,"colLower[");
        this_00 = (HinOut *)std::ostream::operator<<(poVar4,iVar7);
        std::operator<<((ostream *)this_00,"]");
      }
      dVar11 = getdiff(this_00,(this->super_HPreData).colUpper.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar8],
                       (this->ocolUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl
                       .super__Vector_impl_data._M_start[lVar8]);
      if ((dVar11 != 0.0) || (NAN(dVar11))) {
        poVar4 = std::operator<<((ostream *)&std::cout,"colUpper[");
        this_00 = (HinOut *)std::ostream::operator<<(poVar4,iVar7);
        std::operator<<((ostream *)this_00,"]");
      }
      uVar5 = (ulong)(uint)(this->super_HPreData).numCol;
    }
    if (lvl != 1) {
      for (lVar8 = 0; lVar8 < (this->super_HPreData).numRow; lVar8 = lVar8 + 1) {
        dVar11 = getdiff(this_00,(this->super_HPreData).rowLower.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar8],
                         (this->orowLower).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar8]);
        if ((dVar11 != 0.0) || (NAN(dVar11))) {
          poVar4 = std::operator<<((ostream *)&std::cout,"rowLower[");
          this_00 = (HinOut *)std::ostream::operator<<(poVar4,(int)lVar8);
          std::operator<<((ostream *)this_00,"]");
        }
        dVar11 = getdiff(this_00,(this->super_HPreData).rowUpper.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar8],
                         (this->orowUpper).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar8]);
        if ((dVar11 != 0.0) || (NAN(dVar11))) {
          poVar4 = std::operator<<((ostream *)&std::cout,"rowUpper[");
          this_00 = (HinOut *)std::ostream::operator<<(poVar4,(int)lVar8);
          std::operator<<((ostream *)this_00,"]");
        }
      }
    }
  }
  return;
}

Assistant:

void HinOut::compareData(int lvl) {
	int i;
	if (numCol != onumCol)
		cout <<"Column counts differ"<<endl;

	if (numRow != onumRow)
		cout <<"Row counts differ"<<endl;

	if (AcountX != oAcountX)
		cout <<"AcountX counts differ"<<endl;


	//matrix
	for (i=0; i<numCol; i++)
		if (Astart[i+1]-Astart[i] != oAstart[i+1]-oAstart[i])
			cout<<"col length different: col["<<i<<"]\n";

	cout<<flush;

//
//	for (i=0; i<AcountX; i++)
//		if (Aindex[i] != oAindex[i])
//			cout<<"Aindex["<<i<<"]";
//
//	for (i=0; i<AcountX; i++)
//		if (getdiff(Avalue[i] , oAvalue[i]))
//			cout<<"Avalue["<<i<<"]";

	//Aindex and Avalue can differ in their order:
	for (int j=0; j<numCol; j++) {
		vector<pair<int, double>> columnA, columnOA;
		for (int k=Astart[j]; k<Astart[j+1]; k++) {
			pair<int, double> p(Aindex[k], Avalue[k]);
			columnA.push_back(p);
		}

		for (int k=oAstart[j]; k<oAstart[j+1]; k++) {
			//pair<int, double> p(oAindex[k], oAvalue[k]);
			for (size_t l=0;l < columnA.size(); l++)
				if (get<0>(columnA[l])==oAindex[k]) {
					if (get<1>(columnA[l])==oAvalue[k]) {
						columnA.erase(columnA.begin() + l);
						continue;
					}
					else {
						cout<<"mismatch in row "<<Aindex[k]<<" col "<<j<< " in Avalue: "<< get<1>(columnA[i]) << " in oAvalue: "<< oAvalue[k] <<endl;
					}
				}
			//columnOA.push_back(p);
		}
	}






	if (lvl > 0) {


	for (i=0; i<numCol; i++) {
		if (getdiff(colCost[i] , ocolCost[i]))
			cout<<"colCost["<<i<<"]";
		if (getdiff(colLower[i] , ocolLower[i]))
			cout<<"colLower["<<i<<"]";
		if (getdiff(colUpper[i] , ocolUpper[i]))
			cout<<"colUpper["<<i<<"]";

	}

	}
	if (lvl>1) {


	for (i=0; i<numRow; i++) {
		if (getdiff(rowLower[i] , orowLower[i]))
			cout<<"rowLower["<<i<<"]";
		if (getdiff(rowUpper[i] , orowUpper[i]))
			cout<<"rowUpper["<<i<<"]";
	}

	}

}